

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

void Abc_NtkDontCareWinCollectRoots(Odc_Man_t *p)

{
  Vec_Ptr_t *vRoots;
  int iVar1;
  
  iVar1 = Abc_NodeIsTravIdCurrent(p->pNode);
  if (iVar1 == 0) {
    Abc_NodeSetTravIdCurrent(p->pNode);
    vRoots = p->vRoots;
    vRoots->nSize = 0;
    Abc_NtkDontCareWinCollectRoots_rec(p->pNode,vRoots);
    return;
  }
  __assert_fail("!Abc_NodeIsTravIdCurrent(p->pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcOdc.c"
                ,399,"void Abc_NtkDontCareWinCollectRoots(Odc_Man_t *)");
}

Assistant:

void Abc_NtkDontCareWinCollectRoots( Odc_Man_t * p )
{
    assert( !Abc_NodeIsTravIdCurrent(p->pNode) );
    // mark the node with the old traversal ID
    Abc_NodeSetTravIdCurrent( p->pNode ); 
    // collect the roots
    Vec_PtrClear( p->vRoots );
    Abc_NtkDontCareWinCollectRoots_rec( p->pNode, p->vRoots );
}